

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O1

void __thiscall QToolBarAreaLayout::QToolBarAreaLayout(QToolBarAreaLayout *this,QMainWindow *win)

{
  undefined8 *puVar1;
  long lVar2;
  QToolBarAreaLayoutInfo *pQVar3;
  int i;
  long in_FS_OFFSET;
  QArrayDataPointer<QToolBarAreaLayoutLine> local_88;
  QArrayDataPointer<QToolBarAreaLayoutLine> local_68;
  undefined8 uStack_50;
  undefined1 local_48;
  undefined7 uStack_47;
  undefined4 uStack_40;
  uint uStack_3c;
  undefined1 uStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (this->rect).x1 = 0;
  (this->rect).y1 = 0;
  (this->rect).x2 = -1;
  (this->rect).y2 = -1;
  this->mainWindow = win;
  lVar2 = 0;
  do {
    puVar1 = (undefined8 *)((long)&this->docks[0].lines.d.size + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&this->docks[0].lines.d.d + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&this->docks[0].rect.x2.m_i + lVar2);
    *puVar1 = 0xffffffffffffffff;
    puVar1[1] = 0x200000001;
    (&this->docks[0].dirty)[lVar2] = false;
    lVar2 = lVar2 + 0x38;
  } while (lVar2 != 0xe0);
  this->visible = true;
  pQVar3 = this->docks;
  lVar2 = 0;
  do {
    uStack_50 = 0;
    local_48 = 0xff;
    uStack_47 = 0xffffffffffffff;
    uStack_3c = (uint)lVar2;
    uStack_38 = 0;
    if ((uStack_3c - 2 < 2) || (1 < uStack_3c)) {
      uStack_40 = 1;
    }
    else {
      uStack_40 = 2;
    }
    local_68.d = (Data *)0x0;
    local_68.ptr = (QToolBarAreaLayoutLine *)0x0;
    local_68.size = 0;
    local_88.d = (pQVar3->lines).d.d;
    local_88.ptr = (pQVar3->lines).d.ptr;
    (pQVar3->lines).d.d = (Data *)0x0;
    (pQVar3->lines).d.ptr = (QToolBarAreaLayoutLine *)0x0;
    local_88.size = (pQVar3->lines).d.size;
    (pQVar3->lines).d.size = 0;
    QArrayDataPointer<QToolBarAreaLayoutLine>::~QArrayDataPointer(&local_88);
    *(ulong *)((long)&(pQVar3->rect).x2.m_i + 1) = CONCAT17((undefined1)uStack_40,uStack_47);
    *(ulong *)((long)&pQVar3->o + 1) = CONCAT17(uStack_38,CONCAT43(uStack_3c,uStack_40._1_3_));
    (pQVar3->rect).x1 = (Representation)(undefined4)uStack_50;
    (pQVar3->rect).y1 = (Representation)uStack_50._4_4_;
    (pQVar3->rect).x2 = (Representation)(int)CONCAT71(uStack_47,local_48);
    (pQVar3->rect).y2 = (Representation)(int)((uint7)uStack_47 >> 0x18);
    QArrayDataPointer<QToolBarAreaLayoutLine>::~QArrayDataPointer(&local_68);
    lVar2 = lVar2 + 1;
    pQVar3 = pQVar3 + 1;
  } while (lVar2 != 4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QToolBarAreaLayout::QToolBarAreaLayout(const QMainWindow *win) : mainWindow(win), visible(true)
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        QInternal::DockPosition pos = static_cast<QInternal::DockPosition>(i);
        docks[i] = QToolBarAreaLayoutInfo(pos);
    }
}